

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::truncF32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  unary<4,_&wasm::Literal::getLanesF32x4,_&wasm::Literal::trunc,_&wasm::passThrough>
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncF32x4() const {
  return unary<4, &Literal::getLanesF32x4, &Literal::trunc>(*this);
}